

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O3

void ssh2_transport_gss_update(ssh2_transport_state *s,_Bool definitely_rekeying)

{
  ssh_gss_library *psVar1;
  _Bool _Var2;
  Ssh_gss_stat SVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  ssh_connection_shared_gss_state *psVar7;
  LogContext *pLVar8;
  time_t *ptVar9;
  double dVar10;
  Ssh_gss_ctx gss_ctx;
  time_t gss_cred_expiry;
  Ssh_gss_buf local_48;
  Ssh_gss_buf local_38;
  
  s->gss_status = 0;
  if (s->shgss->libs->nlibraries != 0) {
    _Var2 = conf_get_bool(s->conf,0x2a);
    if ((!_Var2) && (_Var2 = conf_get_bool(s->conf,0x2b), !_Var2)) {
      return;
    }
    psVar7 = s->shgss;
    if (psVar7->srv_name == (Ssh_gss_name)0x0) {
      SVar3 = (*psVar7->lib->import_name)(psVar7->lib,s->fullhostname,&psVar7->srv_name);
      if (SVar3 == SSH_GSS_BAD_HOST_NAME) {
        pLVar8 = (s->ppl).logctx;
        pcVar5 = "GSSAPI import name failed - Bad service name; won\'t use GSS key exchange";
LAB_001290e3:
        pcVar5 = dupprintf(pcVar5);
        logevent_and_free(pLVar8,pcVar5);
        return;
      }
      if (SVar3 != SSH_GSS_OK) {
        pLVar8 = (s->ppl).logctx;
        pcVar5 = "GSSAPI import name failed; won\'t use GSS key exchange";
        goto LAB_001290e3;
      }
      psVar7 = s->shgss;
    }
    SVar3 = (*psVar7->lib->acquire_cred)(psVar7->lib,&gss_ctx,&gss_cred_expiry);
    if (SVar3 == SSH_GSS_OK) {
      local_48.length = 0;
      local_48.value = (void *)0x0;
      local_38.length = 0;
      local_38.value = (void *)0x0;
      psVar1 = s->shgss->lib;
      ptVar9 = &gss_cred_expiry;
      if (gss_cred_expiry != -1) {
        ptVar9 = (time_t *)0x0;
      }
      SVar3 = (*psVar1->init_sec_context)
                        (psVar1,&gss_ctx,s->shgss->srv_name,0,&local_38,&local_48,ptVar9,
                         &s->gss_ctxt_lifetime);
      if (gss_ctx != (Ssh_gss_ctx)0x0) {
        psVar1 = s->shgss->lib;
        (*psVar1->release_cred)(psVar1,&gss_ctx);
      }
      if (SVar3 < SSH_GSS_NO_MEM) {
        if (local_48.length != 0) {
          psVar1 = s->shgss->lib;
          (*psVar1->free_tok)(psVar1,&local_48);
        }
        uVar6 = s->gss_status;
        s->gss_status = uVar6 | 1;
        if (s->gss_ctxt_lifetime < 5) {
          s->gss_status = uVar6 | 9;
        }
        _Var2 = conf_get_bool(s->conf,0x2c);
        if (_Var2) {
          if ((s->gss_cred_expiry != -1) &&
             (dVar10 = difftime(gss_cred_expiry,s->gss_cred_expiry), 0.0 < dVar10)) {
            *(byte *)&s->gss_status = (byte)s->gss_status | 2;
          }
          uVar4 = conf_get_int(s->conf,0x2d);
          uVar6 = 2;
          if (uVar4 < 0x8bd0) {
            uVar6 = uVar4;
          }
          if ((uVar6 != 0) && (s->gss_ctxt_lifetime <= (ulong)((long)(int)uVar6 * 0x3c))) {
            *(byte *)&s->gss_status = (byte)s->gss_status | 4;
          }
        }
      }
      else if (definitely_rekeying) {
        pLVar8 = (s->ppl).logctx;
        pcVar5 = dupprintf("No GSSAPI security context available");
        logevent_and_free(pLVar8,pcVar5);
      }
    }
  }
  return;
}

Assistant:

static void ssh2_transport_gss_update(struct ssh2_transport_state *s,
                                      bool definitely_rekeying)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    int gss_stat;
    time_t gss_cred_expiry;
    unsigned long mins;
    Ssh_gss_buf gss_sndtok;
    Ssh_gss_buf gss_rcvtok;
    Ssh_gss_ctx gss_ctx;

    s->gss_status = 0;

    /*
     * Nothing to do if no GSSAPI libraries are configured or GSSAPI
     * auth is not enabled.
     */
    if (s->shgss->libs->nlibraries == 0)
        return;
    if (!conf_get_bool(s->conf, CONF_try_gssapi_auth) &&
        !conf_get_bool(s->conf, CONF_try_gssapi_kex))
        return;

    /* Import server name and cache it */
    if (s->shgss->srv_name == GSS_C_NO_NAME) {
        gss_stat = s->shgss->lib->import_name(
            s->shgss->lib, s->fullhostname, &s->shgss->srv_name);
        if (gss_stat != SSH_GSS_OK) {
            if (gss_stat == SSH_GSS_BAD_HOST_NAME)
                ppl_logevent("GSSAPI import name failed - Bad service name;"
                             " won't use GSS key exchange");
            else
                ppl_logevent("GSSAPI import name failed;"
                             " won't use GSS key exchange");
            return;
        }
    }

    /*
     * Do we (still) have credentials? Capture the credential
     * expiration when available
     */
    gss_stat = s->shgss->lib->acquire_cred(
        s->shgss->lib, &gss_ctx, &gss_cred_expiry);
    if (gss_stat != SSH_GSS_OK)
        return;

    SSH_GSS_CLEAR_BUF(&gss_sndtok);
    SSH_GSS_CLEAR_BUF(&gss_rcvtok);

    /*
     * When acquire_cred yields no useful expiration, get a proxy for
     * the cred expiration from the context expiration.
     */
    gss_stat = s->shgss->lib->init_sec_context(
        s->shgss->lib, &gss_ctx, s->shgss->srv_name,
        0 /* don't delegate */, &gss_rcvtok, &gss_sndtok,
        (gss_cred_expiry == GSS_NO_EXPIRATION ? &gss_cred_expiry : NULL),
        &s->gss_ctxt_lifetime);

    /* This context was for testing only. */
    if (gss_ctx)
        s->shgss->lib->release_cred(s->shgss->lib, &gss_ctx);

    if (gss_stat != SSH_GSS_OK &&
        gss_stat != SSH_GSS_S_CONTINUE_NEEDED) {
        /*
         * No point in verbosely interrupting the user to tell them we
         * couldn't get GSS credentials, if this was only a check
         * between key exchanges to see if fresh ones were available.
         * When we do do a rekey, this message (if displayed) will
         * appear among the standard rekey blurb, but when we're not,
         * it shouldn't pop up all the time regardless.
         */
        if (definitely_rekeying)
            ppl_logevent("No GSSAPI security context available");

        return;
    }

    if (gss_sndtok.length)
        s->shgss->lib->free_tok(s->shgss->lib, &gss_sndtok);

    s->gss_status |= GSS_KEX_CAPABLE;

    /*
     * When rekeying to cascade, avoid doing this too close to the
     * context expiration time, since the key exchange might fail.
     */
    if (s->gss_ctxt_lifetime < MIN_CTXT_LIFETIME)
        s->gss_status |= GSS_CTXT_MAYFAIL;

    /*
     * If we're not delegating credentials, rekeying is not used to
     * refresh them. We must avoid setting GSS_CRED_UPDATED or
     * GSS_CTXT_EXPIRES when credential delegation is disabled.
     */
    if (!conf_get_bool(s->conf, CONF_gssapifwd))
        return;

    if (s->gss_cred_expiry != GSS_NO_EXPIRATION &&
        difftime(gss_cred_expiry, s->gss_cred_expiry) > 0)
        s->gss_status |= GSS_CRED_UPDATED;

    mins = sanitise_rekey_time(
        conf_get_int(s->conf, CONF_gssapirekey), GSS_DEF_REKEY_MINS);
    if (mins > 0 && s->gss_ctxt_lifetime <= mins * 60)
        s->gss_status |= GSS_CTXT_EXPIRES;
}